

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void ipred_ipf_core(pel *src,pel *dst,int i_dst,int flt_range_hor,int flt_range_ver,s8 *flt_hor_coef
                   ,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  pel pVar5;
  uint uVar6;
  s32 coeff_cur;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  s32 col;
  
  uVar8 = ~(-1 << ((byte)bit_depth & 0x1f));
  uVar1 = (ulong)(uint)flt_range_hor;
  if (flt_range_hor < 1) {
    uVar1 = 0;
  }
  uVar4 = (ulong)(uint)flt_range_ver;
  if (flt_range_ver < 1) {
    uVar4 = 0;
  }
  for (uVar2 = 0; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    iVar9 = (int)flt_ver_coef[uVar2];
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = (int)((uint)dst[uVar7] * ((0x40 - iVar9) - (int)flt_hor_coef[uVar7]) +
                    (uint)src[uVar7 + 1] * iVar9 + (uint)src[~uVar2] * (int)flt_hor_coef[uVar7] +
                   0x20) >> 6;
      uVar6 = uVar3;
      if ((int)uVar8 <= (int)uVar3) {
        uVar6 = uVar8;
      }
      pVar5 = (pel)uVar6;
      if ((int)uVar3 < 0) {
        pVar5 = '\0';
      }
      dst[uVar7] = pVar5;
    }
    for (uVar7 = uVar1; (long)uVar7 < (long)w; uVar7 = uVar7 + 1) {
      uVar3 = (int)((uint)src[uVar7 + 1] * iVar9 + (uint)dst[uVar7] * (0x40 - iVar9) + 0x20) >> 6;
      uVar6 = uVar8;
      if ((int)uVar3 < (int)uVar8) {
        uVar6 = uVar3;
      }
      pVar5 = (pel)uVar6;
      if ((int)uVar3 < 0) {
        pVar5 = '\0';
      }
      dst[uVar7] = pVar5;
    }
    dst = dst + i_dst;
  }
  for (; (long)uVar4 < (long)h; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = (int)((uint)src[(int)~(uint)uVar4] * (int)flt_hor_coef[uVar2] +
                    (uint)dst[uVar2] * (0x40 - flt_hor_coef[uVar2]) + 0x20) >> 6;
      uVar6 = uVar3;
      if ((int)uVar8 <= (int)uVar3) {
        uVar6 = uVar8;
      }
      pVar5 = (pel)uVar6;
      if ((int)uVar3 < 0) {
        pVar5 = '\0';
      }
      dst[uVar2] = pVar5;
    }
    dst = dst + i_dst;
  }
  return;
}

Assistant:

void ipred_ipf_core(pel *src, pel *dst, int i_dst, int flt_range_hor, int flt_range_ver, const s8* flt_hor_coef, const s8* flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;
        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
}